

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O2

x86_reg X86_insn_reg_att(uint id,cs_ac_type *access)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 0;
  do {
    lVar2 = lVar1;
    if (lVar2 + 0xc == 0x4d4) {
      return X86_REG_INVALID;
    }
    lVar1 = lVar2 + 0xc;
  } while (*(ushort *)((long)&insn_regs_att[0].insn + lVar2) != id);
  if (access != (cs_ac_type *)0x0) {
    *access = CS_AC_INVALID;
  }
  return *(x86_reg *)((long)&insn_regs_att[0].reg + lVar2);
}

Assistant:

x86_reg X86_insn_reg_att(unsigned int id, enum cs_ac_type *access)
{
	unsigned int i;

	for (i = 0; i < ARR_SIZE(insn_regs_att); i++) {
		if (insn_regs_att[i].insn == id) {
			if (access)
				*access = insn_regs_att[i].access;
			return insn_regs_att[i].reg;
		}
	}

	// not found
	return 0;
}